

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O3

void duckdb::Leaf::TransformToNested(ART *art,Node *node)

{
  byte *pbVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  ulong uVar3;
  ARTConflictType AVar4;
  Allocator *allocator_00;
  type paVar5;
  iterator iVar6;
  pointer this;
  data_ptr_t pdVar7;
  ulong *data;
  InternalException *this_00;
  idx_t iVar8;
  ulong uVar9;
  long lVar10;
  IndexPointer local_c0;
  Node *local_b8;
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *local_b0;
  string local_a8;
  ARTKey row_id;
  ArenaAllocator allocator;
  
  iVar8 = 0x8000000000000000;
  allocator_00 = Allocator::Get((art->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&allocator,allocator_00,0x800);
  local_c0.data = 0;
  uVar9 = (node->super_IndexPointer).data;
  if (uVar9 >> 0x38 != 0) {
    local_b0 = &art->allocators;
    local_b8 = node;
    do {
      paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(local_b0);
      _Var2._M_head_impl =
           paVar5->_M_elems[1].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      local_a8._M_dataplus._M_p = (pointer)(uVar9 & 0xffffffff);
      iVar6 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_a8);
      this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
      pdVar7 = FixedSizeBuffer::Get(this,false);
      lVar10 = (ulong)((uint)(uVar9 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
      pbVar1 = pdVar7 + (_Var2._M_head_impl)->bitmask_offset + lVar10;
      if (pdVar7[(_Var2._M_head_impl)->bitmask_offset + lVar10] != '\0') {
        uVar9 = 0;
        do {
          uVar3 = *(ulong *)(pbVar1 + uVar9 * 8 + 8);
          data = (ulong *)ArenaAllocator::Allocate(&allocator,8);
          *data = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                  | uVar3 << 0x38;
          *(data_t *)data = (char)(uVar3 >> 0x38) + 0x80;
          ARTKey::ARTKey((ARTKey *)&local_a8,(data_ptr_t)data,8);
          row_id.len = (idx_t)local_a8._M_dataplus._M_p;
          row_id.data = (data_ptr_t)local_a8._M_string_length;
          AVar4 = ART::Insert(art,(Node *)&local_c0,&row_id,0,&row_id,GATE_SET,
                              (optional_ptr<duckdb::ART,_true>)0x0,INSERT_DUPLICATES);
          if (AVar4 != NO_CONFLICT) {
            this_00 = (InternalException *)__cxa_allocate_exception(0x10);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"invalid conflict type in Leaf::TransformToNested","");
            InternalException::InternalException(this_00,&local_a8);
            __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < *pbVar1);
      }
      uVar9 = *(ulong *)(pbVar1 + 0x28);
    } while (0xffffffffffffff < uVar9);
    iVar8 = local_c0.data | 0x8000000000000000;
    node = local_b8;
  }
  local_c0.data = iVar8;
  Node::Free(art,node);
  (node->super_IndexPointer).data = local_c0.data;
  ArenaAllocator::~ArenaAllocator(&allocator);
  return;
}

Assistant:

void Leaf::TransformToNested(ART &art, Node &node) {
	D_ASSERT(node.GetType() == LEAF);

	ArenaAllocator allocator(Allocator::Get(art.db));
	Node root = Node();

	// Move all row IDs into the nested leaf.
	reference<const Node> leaf_ref(node);
	while (leaf_ref.get().HasMetadata()) {
		auto &leaf = Node::Ref<const Leaf>(art, leaf_ref, LEAF);
		for (uint8_t i = 0; i < leaf.count; i++) {
			auto row_id = ARTKey::CreateARTKey<row_t>(allocator, leaf.row_ids[i]);
			auto conflict_type =
			    art.Insert(root, row_id, 0, row_id, GateStatus::GATE_SET, nullptr, IndexAppendMode::INSERT_DUPLICATES);
			if (conflict_type != ARTConflictType::NO_CONFLICT) {
				throw InternalException("invalid conflict type in Leaf::TransformToNested");
			}
		}
		leaf_ref = leaf.ptr;
	}

	root.SetGateStatus(GateStatus::GATE_SET);
	Node::Free(art, node);
	node = root;
}